

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QCache<QString,_QConfFile>::Node>::rehash
          (Data<QCache<QString,_QConfFile>::Node> *this,size_t sizeHint)

{
  Entry *pEVar1;
  ulong uVar2;
  Span *pSVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Chain *pCVar6;
  Node *pNVar7;
  ulong uVar8;
  Span *pSVar9;
  size_t index;
  long lVar10;
  size_t sVar11;
  uchar *key;
  long lVar12;
  R_conflict8 RVar13;
  Bucket BVar14;
  QStringView key_00;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar11 = 0x80;
  if ((0x40 < sizeHint) && (sVar11 = 0xffffffffffffffff, sizeHint < 0x4000000000000000)) {
    lVar10 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    sVar11 = 1L << (0x41 - ((byte)lVar10 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar13 = allocateSpans(sVar11);
  this->spans = (Span *)RVar13.spans;
  this->numBuckets = sVar11;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    pSVar9 = pSVar3;
    do {
      lVar10 = 0;
      do {
        if ((ulong)pSVar9->offsets[lVar10] != 0xff) {
          pEVar1 = pSVar3[uVar8].entries + pSVar9->offsets[lVar10];
          key = (pEVar1->storage).data + 0x10;
          key_00.m_data = *(storage_type_conflict **)((pEVar1->storage).data + 0x18);
          key_00.m_size = *(qsizetype *)((pEVar1->storage).data + 0x20);
          sVar11 = ::qHash(key_00,this->seed);
          BVar14 = findBucketWithHash<QString>(this,(QString *)key,sVar11);
          pNVar7 = Span<QCache<QString,_QConfFile>::Node>::insert(BVar14.span,BVar14.index);
          pCVar6 = *(Chain **)((pEVar1->storage).data + 8);
          (pNVar7->super_Chain).prev = *(Chain **)(pEVar1->storage).data;
          (pNVar7->super_Chain).next = pCVar6;
          key[0] = '\0';
          key[1] = '\0';
          key[2] = '\0';
          key[3] = '\0';
          key[4] = '\0';
          key[5] = '\0';
          key[6] = '\0';
          key[7] = '\0';
          (pNVar7->key).d.d = *(Data **)key;
          pcVar4 = *(char16_t **)((pEVar1->storage).data + 0x18);
          (pEVar1->storage).data[0x18] = '\0';
          (pEVar1->storage).data[0x19] = '\0';
          (pEVar1->storage).data[0x1a] = '\0';
          (pEVar1->storage).data[0x1b] = '\0';
          (pEVar1->storage).data[0x1c] = '\0';
          (pEVar1->storage).data[0x1d] = '\0';
          (pEVar1->storage).data[0x1e] = '\0';
          (pEVar1->storage).data[0x1f] = '\0';
          (pNVar7->key).d.ptr = pcVar4;
          qVar5 = *(qsizetype *)((pEVar1->storage).data + 0x20);
          (pEVar1->storage).data[0x20] = '\0';
          (pEVar1->storage).data[0x21] = '\0';
          (pEVar1->storage).data[0x22] = '\0';
          (pEVar1->storage).data[0x23] = '\0';
          (pEVar1->storage).data[0x24] = '\0';
          (pEVar1->storage).data[0x25] = '\0';
          (pEVar1->storage).data[0x26] = '\0';
          (pEVar1->storage).data[0x27] = '\0';
          (pNVar7->key).d.size = qVar5;
          (pNVar7->value).t = *(QConfFile **)((pEVar1->storage).data + 0x28);
          (pNVar7->value).cost = *(qsizetype *)((pEVar1->storage).data + 0x30);
          (pEVar1->storage).data[0x28] = '\0';
          (pEVar1->storage).data[0x29] = '\0';
          (pEVar1->storage).data[0x2a] = '\0';
          (pEVar1->storage).data[0x2b] = '\0';
          (pEVar1->storage).data[0x2c] = '\0';
          (pEVar1->storage).data[0x2d] = '\0';
          (pEVar1->storage).data[0x2e] = '\0';
          (pEVar1->storage).data[0x2f] = '\0';
          ((pNVar7->super_Chain).prev)->next = &pNVar7->super_Chain;
          ((pNVar7->super_Chain).next)->prev = &pNVar7->super_Chain;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      Span<QCache<QString,_QConfFile>::Node>::freeData(pSVar3 + uVar8);
      uVar8 = uVar8 + 1;
      pSVar9 = pSVar9 + 1;
    } while (uVar8 != uVar2 >> 7);
  }
  lVar10 = *(long *)&pSVar3[-1].allocated;
  if (lVar10 != 0) {
    lVar12 = lVar10 * 0x90;
    do {
      Span<QCache<QString,_QConfFile>::Node>::freeData
                ((Span<QCache<QString,_QConfFile>::Node> *)(pSVar3[-1].offsets + lVar12));
      lVar12 = lVar12 + -0x90;
    } while (lVar12 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar10 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }